

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_env_copyfd2(MDB_env *env,int fd,uint flags)

{
  char *__dest;
  uint uVar1;
  uint uVar2;
  MDB_db *pMVar3;
  pgno_t pVar4;
  pgno_t pVar5;
  pgno_t pVar6;
  MDB_txn *txn_00;
  int iVar7;
  ssize_t sVar8;
  int *piVar9;
  size_t __n;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  pthread_mutex_t *mutex;
  MDB_dbx *pMVar13;
  ulong uVar14;
  undefined8 txn_01;
  MDB_txn *txn;
  pthread_t thr;
  MDB_val key;
  MDB_cursor mc;
  MDB_txn *local_2a0;
  char *local_298;
  pthread_t local_290;
  MDB_val local_288;
  MDB_val local_278;
  pthread_mutex_t local_268;
  pthread_cond_t local_240;
  char *local_210;
  char *local_208;
  MDB_env *local_1f0;
  MDB_txn *local_1e8;
  int local_1e0 [7];
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  MDB_cursor local_1b8;
  
  if ((flags & 1) != 0) {
    local_2a0 = (MDB_txn *)0x0;
    pthread_mutex_init((pthread_mutex_t *)&local_268,(pthread_mutexattr_t *)0x0);
    pthread_cond_init(&local_240,(pthread_condattr_t *)0x0);
    iVar7 = posix_memalign(&local_210,(ulong)env->me_os_psize,0x200000);
    local_208 = local_210;
    if (iVar7 != 0) {
      return iVar7;
    }
    memset(local_210,0,0x200000);
    local_208 = local_208 + 0x100000;
    local_1e0[0] = 0;
    local_1e0[1] = 0;
    local_1e0[2] = 0;
    local_1e0[3] = 0;
    local_1e0[4] = 2;
    local_1e0[5] = 0;
    local_1c4 = 0;
    local_1c0 = 1;
    local_1bc = 0;
    local_1f0 = env;
    local_1e0[6] = fd;
    pthread_create(&local_290,(pthread_attr_t *)0x0,mdb_env_copythr,&local_268);
    iVar7 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,&local_2a0);
    pcVar12 = local_210;
    if (iVar7 != 0) {
      return iVar7;
    }
    lVar10 = 0;
    memset(local_210,0,(ulong)(env->me_psize * 2));
    pcVar12[0] = '\0';
    pcVar12[1] = '\0';
    pcVar12[2] = '\0';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    pcVar12[10] = '\b';
    pcVar12[0xb] = '\0';
    pcVar12[0x10] = -0x22;
    pcVar12[0x11] = -0x40;
    pcVar12[0x12] = -0x11;
    pcVar12[0x13] = -0x42;
    pcVar12[0x14] = '\x01';
    pcVar12[0x15] = '\0';
    pcVar12[0x16] = '\0';
    pcVar12[0x17] = '\0';
    *(mdb_size_t *)(pcVar12 + 0x20) = env->me_mapsize;
    uVar1 = env->me_psize;
    *(uint *)(pcVar12 + 0x28) = uVar1;
    pcVar12[0x88] = '\x01';
    pcVar12[0x89] = '\0';
    pcVar12[0x8a] = '\0';
    pcVar12[0x8b] = '\0';
    pcVar12[0x8c] = '\0';
    pcVar12[0x8d] = '\0';
    pcVar12[0x8e] = '\0';
    pcVar12[0x8f] = '\0';
    *(ushort *)(pcVar12 + 0x2c) = (ushort)env->me_flags | 8;
    pcVar12[0x50] = -1;
    pcVar12[0x51] = -1;
    pcVar12[0x52] = -1;
    pcVar12[0x53] = -1;
    pcVar12[0x54] = -1;
    pcVar12[0x55] = -1;
    pcVar12[0x56] = -1;
    pcVar12[0x57] = -1;
    pcVar12[0x80] = -1;
    pcVar12[0x81] = -1;
    pcVar12[0x82] = -1;
    pcVar12[0x83] = -1;
    pcVar12[0x84] = -1;
    pcVar12[0x85] = -1;
    pcVar12[0x86] = -1;
    pcVar12[0x87] = -1;
    *(void **)(pcVar12 + 0x18) = env->me_metas[0]->mm_address;
    local_298 = local_210 + uVar1;
    __dest = local_210 + (ulong)uVar1 + 0x10;
    __dest[-0x10] = '\x01';
    __dest[-0xf] = '\0';
    __dest[-0xe] = '\0';
    __dest[-0xd] = '\0';
    __dest[-0xc] = '\0';
    __dest[-0xb] = '\0';
    __dest[-10] = '\0';
    __dest[-9] = '\0';
    __dest[-6] = '\b';
    __dest[-5] = '\0';
    memcpy(__dest,pcVar12 + 0x10,0x88);
    txn_00 = local_2a0;
    mdb_cursor_init(&local_1b8,local_2a0,0,(MDB_xcursor *)0x0);
    iVar7 = mdb_cursor_get(&local_1b8,&local_278,&local_288,MDB_NEXT);
    if (iVar7 == 0) {
      lVar10 = 0;
      do {
        lVar10 = lVar10 + *local_288.mv_data;
        iVar7 = mdb_cursor_get(&local_1b8,&local_278,&local_288,MDB_NEXT);
      } while (iVar7 == 0);
    }
    pMVar3 = txn_00->mt_dbs;
    uVar11 = ~(lVar10 + pMVar3->md_branch_pages + pMVar3->md_leaf_pages + pMVar3->md_overflow_pages)
             + txn_00->mt_next_pgno;
    *(ulong *)(local_298 + 0x88) = uVar11;
    pVar4 = pMVar3[1].md_branch_pages;
    pVar5 = pMVar3[1].md_leaf_pages;
    pVar6 = pMVar3[1].md_overflow_pages;
    *(undefined8 *)(local_298 + 0x58) = *(undefined8 *)(pMVar3 + 1);
    *(pgno_t *)(local_298 + 0x60) = pVar4;
    *(pgno_t *)(local_298 + 0x68) = pVar5;
    *(pgno_t *)(local_298 + 0x70) = pVar6;
    *(mdb_size_t *)(local_298 + 0x78) = pMVar3[1].md_entries;
    uVar14 = 0xffffffffffffffff;
    if (1 < uVar11) {
      local_298[0x90] = '\x01';
      local_298[0x91] = '\0';
      local_298[0x92] = '\0';
      local_298[0x93] = '\0';
      local_298[0x94] = '\0';
      local_298[0x95] = '\0';
      local_298[0x96] = '\0';
      local_298[0x97] = '\0';
      uVar14 = uVar11;
    }
    *(ulong *)(local_298 + 0x80) = uVar14;
    local_1e0[0] = env->me_psize * 2;
    local_1e8 = txn_00;
    pthread_mutex_lock((pthread_mutex_t *)&local_268);
    if (local_1c0 != 0) {
      do {
        pthread_cond_wait(&local_240,(pthread_mutex_t *)&local_268);
      } while (local_1c0 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_268);
    iVar7 = mdb_env_cwalk((mdb_copy *)&local_268.__data,&txn_00->mt_dbs[1].md_root,0);
    if ((iVar7 == 0) && (iVar7 = 0, local_1e0[local_1bc] != 0)) {
      iVar7 = mdb_env_cthr_toggle((mdb_copy *)&local_268.__data,1);
    }
    mdb_env_cthr_toggle((mdb_copy *)&local_268.__data,-1);
    pthread_mutex_lock((pthread_mutex_t *)&local_268);
    if (local_1c0 != 0) {
      do {
        pthread_cond_wait(&local_240,(pthread_mutex_t *)&local_268);
      } while (local_1c0 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_268);
    pthread_join(local_290,(void **)0x0);
    mdb_txn_abort(txn_00);
    pthread_cond_destroy(&local_240);
    pthread_mutex_destroy((pthread_mutex_t *)&local_268);
    free(local_210);
    return iVar7;
  }
  local_268.__align = 0;
  iVar7 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,(MDB_txn **)&local_268.__align);
  txn_01 = local_268.__align;
  if (iVar7 != 0) {
    return iVar7;
  }
  if (env->me_txns == (MDB_txninfo *)0x0) {
    mutex = (pthread_mutex_t *)0x0;
  }
  else {
    mdb_txn_end((MDB_txn *)local_268.__align,4);
    mutex = (pthread_mutex_t *)&env->me_txns->mt2;
    iVar7 = pthread_mutex_lock(mutex);
    if ((iVar7 != 0) && (iVar7 = mdb_mutex_failed(env,(mdb_mutexref_t)mutex,iVar7), iVar7 != 0))
    goto LAB_0010f5e8;
    iVar7 = mdb_txn_renew0((MDB_txn *)txn_01);
    if (iVar7 != 0) {
      pthread_mutex_unlock(mutex);
      goto LAB_0010f5e8;
    }
  }
  iVar7 = 0;
  pcVar12 = env->me_map;
  uVar1 = env->me_psize * 2;
  uVar14 = (ulong)uVar1;
  if (uVar1 != 0) {
    do {
      sVar8 = write(fd,pcVar12,uVar14);
      if (sVar8 < 0) {
        piVar9 = __errno_location();
        iVar7 = *piVar9;
        break;
      }
      if (sVar8 == 0) {
        iVar7 = 5;
        break;
      }
      pcVar12 = pcVar12 + sVar8;
      uVar14 = uVar14 - sVar8;
    } while (uVar14 != 0);
  }
  if (mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(mutex);
  }
  txn_01 = local_268.__align;
  if (iVar7 == 0) {
    pVar4 = *(pgno_t *)(local_268.__align + 0x10);
    uVar2 = env->me_psize;
    iVar7 = fstat(env->me_fd,(stat *)&local_1b8);
    if (iVar7 == 0) {
      pMVar13 = (MDB_dbx *)(pVar4 * uVar2);
      if (local_1b8.mc_dbx <= pMVar13) {
        pMVar13 = local_1b8.mc_dbx;
      }
    }
    else {
      piVar9 = __errno_location();
      iVar7 = *piVar9;
      if (iVar7 != 0) goto LAB_0010f5e8;
      pMVar13 = (MDB_dbx *)0x0;
    }
    iVar7 = 0;
    for (uVar14 = (long)pMVar13 - (ulong)uVar1; uVar14 != 0; uVar14 = uVar14 - sVar8) {
      __n = 0x40000000;
      if (uVar14 < 0x40000000) {
        __n = uVar14;
      }
      sVar8 = write(fd,pcVar12,__n);
      if (sVar8 < 0) {
        piVar9 = __errno_location();
        iVar7 = *piVar9;
        break;
      }
      if (sVar8 == 0) {
        iVar7 = 5;
        break;
      }
      pcVar12 = pcVar12 + sVar8;
    }
  }
LAB_0010f5e8:
  mdb_txn_abort((MDB_txn *)txn_01);
  return iVar7;
}

Assistant:

int ESECT
mdb_env_copyfd2(MDB_env *env, HANDLE fd, unsigned int flags)
{
	if (flags & MDB_CP_COMPACT)
		return mdb_env_copyfd1(env, fd);
	else
		return mdb_env_copyfd0(env, fd);
}